

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

int __thiscall Fl_Tree_Item::move(Fl_Tree_Item *this,Fl_Tree_Item *item,int op,int pos)

{
  int iVar1;
  Fl_Tree_Item *pFVar2;
  int local_40;
  int local_3c;
  int to;
  int from;
  Fl_Tree_Item *to_parent;
  Fl_Tree_Item *from_parent;
  int pos_local;
  int op_local;
  Fl_Tree_Item *item_local;
  Fl_Tree_Item *this_local;
  
  if (op == 0) {
    to_parent = parent(this);
    _to = parent(item);
    local_3c = find_child(to_parent,this);
    local_40 = find_child(_to,item);
  }
  else if (op == 1) {
    to_parent = parent(this);
    _to = parent(item);
    local_3c = find_child(to_parent,this);
    local_40 = find_child(_to,item);
  }
  else {
    if (op != 2) {
      return -3;
    }
    to_parent = parent(this);
    local_3c = find_child(to_parent,this);
    local_40 = pos;
    _to = item;
  }
  if ((to_parent == (Fl_Tree_Item *)0x0) || (_to == (Fl_Tree_Item *)0x0)) {
    this_local._4_4_ = -1;
  }
  else if ((local_3c < 0) || (local_40 < 0)) {
    this_local._4_4_ = -2;
  }
  else {
    if (to_parent == _to) {
      if (op == 0) {
        if ((local_3c < local_40) && (0 < local_40)) {
          local_40 = local_40 + -1;
        }
      }
      else if (((op == 1) && (local_40 < local_3c)) && (iVar1 = children(_to), local_40 < iVar1)) {
        local_40 = local_40 + 1;
      }
      iVar1 = move(to_parent,local_40,local_3c);
      if (iVar1 < 0) {
        return -4;
      }
    }
    else {
      iVar1 = children(_to);
      if (iVar1 < local_40) {
        return -4;
      }
      pFVar2 = deparent(to_parent,local_3c);
      if (pFVar2 == (Fl_Tree_Item *)0x0) {
        return -5;
      }
      iVar1 = reparent(_to,this,local_40);
      if (iVar1 < 0) {
        reparent(_to,this,0);
        return -6;
      }
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Tree_Item::move(Fl_Tree_Item *item, int op, int pos) {
  Fl_Tree_Item *from_parent, *to_parent;
  int from, to;
  switch (op) {
    case 0:	// "above"
      from_parent = this->parent();
      to_parent   = item->parent();
      from        = from_parent->find_child(this);
      to          = to_parent->find_child(item);
      break;
    case 1:	// "below"
      from_parent = this->parent();
      to_parent   = item->parent();
      from        = from_parent->find_child(this);
      to          = to_parent->find_child(item);
      break;
    case 2:	// "into"
      from_parent = this->parent();
      to_parent   = item;
      from        = from_parent->find_child(this);
      to          = pos;
      break;
    default:
      return -3;
  }
  if ( !from_parent || !to_parent ) return -1;
  if ( from < 0 || to < 0 ) return -2;
  if ( from_parent == to_parent ) {		// same parent?
    switch (op) {				// 'to' offsets due to scroll
      case 0: if ( from < to && to > 0 ) --to; break;
      case 1: if ( from > to && to < to_parent->children() ) ++to; break;
    }
    if ( from_parent->move(to, from) < 0 )	// simple move among siblings
      return -4;
  } else {					// different parent?
    if ( to > to_parent->children() )		// try to prevent a reparent() error
      return -4;
    if ( from_parent->deparent(from) == NULL )	// deparent self from current parent
      return -5;
    if ( to_parent->reparent(this, to) < 0 ) {	// reparent self to new parent at position 'to'
      to_parent->reparent(this, 0);		// failed? shouldn't happen, reparent at 0
      return -6;
    }
  }
  return 0;
}